

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  unsigned_short *puVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uchar *puVar13;
  ulong uVar14;
  uint uVar15;
  uchar *puVar16;
  uchar *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  size_t sVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uchar *puVar29;
  ulong uVar30;
  size_t left;
  ulong uVar31;
  size_t left_1;
  uchar *puVar32;
  ulong uVar33;
  bool bVar34;
  uint local_bc;
  
  uVar10 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar10 = windowsize;
  }
  uVar20 = 0x40;
  if (0x1fff < windowsize) {
    uVar20 = 0x102;
  }
  uVar24 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar15 = windowsize - 1;
    uVar24 = 0x5a;
    if ((windowsize & uVar15) == 0) {
      uVar24 = 0x102;
      if (nicematch < 0x102) {
        uVar24 = nicematch;
      }
      if (inpos < insize) {
        puVar13 = in + insize;
        uVar9 = 0;
        uVar8 = 0;
        bVar7 = false;
        uVar23 = 0;
        do {
          uVar11 = getHash(in,insize,inpos);
          uVar30 = 0;
          if (uVar11 == 0) {
            if (uVar23 == 0) {
              puVar17 = in + inpos + 0x102;
              if (puVar13 < in + inpos + 0x102) {
                puVar17 = puVar13;
              }
              puVar16 = in + inpos;
              puVar32 = puVar16;
              for (puVar29 = puVar16; (puVar29 != puVar17 && (puVar32 = puVar29, *puVar29 == '\0'));
                  puVar29 = puVar29 + 1) {
                puVar32 = puVar17;
              }
              uVar30 = (ulong)(uint)((int)puVar32 - (int)puVar16);
            }
            else {
              if ((insize < uVar23 + inpos) || (in[(uVar23 + inpos) - 1] != '\0')) {
                uVar23 = uVar23 - 1;
              }
              uVar30 = (ulong)uVar23;
            }
          }
          uVar23 = (uint)uVar30;
          uVar26 = (uint)inpos & uVar15;
          uVar14 = (ulong)uVar26;
          piVar3 = hash->val;
          piVar3[uVar14] = uVar11;
          piVar4 = hash->head;
          if (piVar4[uVar11] != -1) {
            hash->chain[uVar14] = (unsigned_short)piVar4[uVar11];
          }
          piVar4[uVar11] = uVar26;
          puVar5 = hash->zeros;
          puVar5[uVar14] = (unsigned_short)uVar30;
          piVar6 = hash->headz;
          if (piVar6[uVar30 & 0xffff] != -1) {
            hash->chainz[uVar14] = (unsigned_short)piVar6[uVar30 & 0xffff];
          }
          uVar31 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar31 = insize;
          }
          piVar6[uVar30 & 0xffff] = uVar26;
          if (uVar10 == 0) {
            local_bc = 0;
            uVar26 = 0;
          }
          else {
            puVar17 = in + inpos;
            uVar26 = 0;
            local_bc = 0;
            uVar18 = 0;
            uVar19 = (ulong)hash->chain[uVar14];
            uVar12 = 1;
            do {
              uVar25 = 0;
              if (uVar14 < uVar19) {
                uVar25 = (ulong)windowsize;
              }
              uVar25 = (uVar14 - uVar19) + uVar25;
              uVar21 = (uint)uVar25;
              if (uVar21 < (uint)uVar18) break;
              if (uVar25 != 0) {
                puVar32 = in + (inpos - (uVar25 & 0xffffffff));
                puVar29 = puVar17;
                if (2 < uVar23) {
                  uVar18 = (ulong)(uint)puVar5[uVar19];
                  if (uVar23 < puVar5[uVar19]) {
                    uVar18 = uVar30;
                  }
                  puVar32 = puVar32 + uVar18;
                  puVar29 = puVar17 + uVar18;
                }
                iVar27 = (int)(in + uVar31);
                for (; puVar29 != in + uVar31; puVar29 = puVar29 + 1) {
                  if (*puVar32 != *puVar29) {
                    iVar27 = (int)puVar29;
                    break;
                  }
                  puVar32 = puVar32 + 1;
                }
                uVar28 = iVar27 - (int)puVar17;
                if ((uVar26 < uVar28) && (uVar26 = uVar28, local_bc = uVar21, uVar24 <= uVar28))
                break;
              }
              uVar2 = hash->chain[uVar19];
              uVar33 = (ulong)uVar2;
              if ((ushort)uVar19 == uVar2) break;
              if ((uVar23 < 3) || (uVar26 <= uVar23)) {
                if (piVar3[uVar2] != uVar11) break;
              }
              else {
                uVar33 = (ulong)hash->chainz[uVar19];
                if (uVar23 != puVar5[uVar33]) break;
              }
              bVar34 = uVar12 != uVar10;
              uVar18 = uVar25;
              uVar19 = uVar33;
              uVar12 = uVar12 + 1;
            } while (bVar34);
          }
          bVar34 = bVar7;
          if (lazymatching == 0) {
LAB_00110a8e:
            if ((2 < uVar26) && (windowsize < local_bc)) {
              return 0x56;
            }
            bVar7 = bVar34;
            if (((uVar26 < 3) || (uVar26 < minmatch)) || ((uVar26 == 3 && (0x1000 < local_bc)))) {
              bVar1 = in[inpos];
              uVar11 = uivector_resize(out,out->size + 1);
              if (uVar11 == 0) {
                return 0x53;
              }
              out->data[out->size - 1] = (uint)bVar1;
            }
            else {
              uVar14 = 0x1c;
              uVar31 = 1;
              do {
                uVar18 = uVar14 + uVar31 >> 1;
                if (LENGTHBASE[uVar18] < uVar26) {
                  uVar31 = uVar18 + 1;
                }
                else {
                  uVar14 = uVar18 - 1;
                }
              } while (uVar31 <= uVar14);
              if ((0x1c < uVar31) || (uVar26 < LENGTHBASE[uVar31])) {
                uVar31 = uVar31 - 1;
              }
              uVar23 = LENGTHBASE[uVar31 & 0xffffffff];
              uVar14 = 0x1d;
              uVar18 = 1;
              do {
                uVar19 = uVar14 + uVar18 >> 1;
                if (DISTANCEBASE[uVar19] < local_bc) {
                  uVar18 = uVar19 + 1;
                }
                else {
                  uVar14 = uVar19 - 1;
                }
              } while (uVar18 <= uVar14);
              if ((0x1d < uVar18) || (local_bc < DISTANCEBASE[uVar18])) {
                uVar18 = uVar18 - 1;
              }
              uVar11 = DISTANCEBASE[uVar18 & 0xffffffff];
              uVar12 = uivector_resize(out,out->size + 1);
              sVar22 = out->size;
              if (uVar12 != 0) {
                out->data[sVar22 - 1] = (int)uVar31 + 0x101;
              }
              uVar12 = uivector_resize(out,sVar22 + 1);
              sVar22 = out->size;
              if (uVar12 != 0) {
                out->data[sVar22 - 1] = uVar26 - uVar23;
              }
              uVar23 = uivector_resize(out,sVar22 + 1);
              sVar22 = out->size;
              if (uVar23 != 0) {
                out->data[sVar22 - 1] = (uint)uVar18;
              }
              uVar23 = uivector_resize(out,sVar22 + 1);
              if (uVar23 != 0) {
                out->data[out->size - 1] = local_bc - uVar11;
              }
              piVar3 = hash->head;
              piVar4 = hash->val;
              puVar5 = hash->zeros;
              piVar6 = hash->headz;
              uVar11 = 1;
              sVar22 = inpos;
              do {
                inpos = sVar22 + 1;
                uVar12 = getHash(in,insize,inpos);
                uVar14 = 0;
                if (uVar12 == 0) {
                  if ((int)uVar30 == 0) {
                    puVar17 = in + sVar22 + 0x103;
                    if (puVar13 < in + sVar22 + 0x103) {
                      puVar17 = puVar13;
                    }
                    puVar29 = in + inpos;
                    puVar16 = puVar29;
                    for (puVar32 = puVar29;
                        (puVar32 != puVar17 && (puVar16 = puVar32, *puVar32 == '\0'));
                        puVar32 = puVar32 + 1) {
                      puVar16 = puVar17;
                    }
                    uVar14 = (ulong)(uint)((int)puVar16 - (int)puVar29);
                  }
                  else if ((insize < uVar30 + inpos) ||
                          (uVar14 = uVar30, in[uVar30 + sVar22] != '\0')) {
                    uVar14 = (ulong)((int)uVar30 - 1);
                  }
                }
                uVar23 = (uint)uVar14;
                uVar21 = (uint)inpos & uVar15;
                piVar4[uVar21] = uVar12;
                iVar27 = piVar3[uVar12];
                if (iVar27 != -1) {
                  hash->chain[uVar21] = (unsigned_short)iVar27;
                }
                piVar3[uVar12] = uVar21;
                puVar5[uVar21] = (unsigned_short)uVar14;
                iVar27 = piVar6[uVar14 & 0xffff];
                if (iVar27 != -1) {
                  hash->chainz[uVar21] = (unsigned_short)iVar27;
                }
                piVar6[uVar14 & 0xffff] = uVar21;
                uVar11 = uVar11 + 1;
                sVar22 = inpos;
                uVar30 = uVar14;
              } while (uVar11 != uVar26);
            }
          }
          else {
            if ((bVar7) || (uVar26 < 3)) {
              bVar34 = false;
              if (bVar7) {
                if (inpos == 0) {
                  return 0x51;
                }
                if (uVar8 + 1 < uVar26) {
                  bVar1 = in[inpos - 1];
                  uVar11 = uivector_resize(out,out->size + 1);
                  if (uVar11 == 0) {
                    return 0x53;
                  }
                  out->data[out->size - 1] = (uint)bVar1;
                  bVar34 = false;
                }
                else {
                  piVar4[uVar11] = -1;
                  piVar6[uVar30] = -1;
                  inpos = inpos - 1;
                  local_bc = uVar9;
                  uVar26 = uVar8;
                  bVar34 = false;
                }
              }
              goto LAB_00110a8e;
            }
            bVar34 = false;
            if (uVar20 < uVar26 || 0x101 < uVar26) goto LAB_00110a8e;
            bVar7 = true;
            uVar8 = uVar26;
            uVar9 = local_bc;
          }
          inpos = inpos + 1;
        } while (inpos < insize);
      }
      uVar24 = 0;
    }
  }
  return uVar24;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}